

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenMatrixBaseSerialize.hpp
# Opt level: O3

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::
serialize<boost::archive::text_iarchive>
          (PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this,text_iarchive *ar,
          uint version)

{
  ulong uVar1;
  undefined8 *puVar2;
  int iVar3;
  long lVar4;
  undefined1 *this_00;
  long lVar5;
  long lVar6;
  long lVar7;
  int c;
  int r;
  int local_38;
  uint local_34;
  
  local_34 = (uint)(this->m_storage).m_rows;
  local_38 = (int)(this->m_storage).m_cols;
  this_00 = &ar->field_0x28;
  boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
  load<int>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)this_00,
            (int *)&local_34);
  boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
  load<int>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)this_00,
            &local_38);
  lVar6 = (long)(int)local_34;
  lVar4 = (long)local_38;
  if ((lVar4 != 0 && lVar6 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar4),0) < lVar6)) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = operator_delete;
    __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  DenseStorage<double,_-1,_-1,_-1,_0>::resize(&this->m_storage,lVar4 * lVar6,lVar6,lVar4);
  if (0 < local_38) {
    uVar1 = (ulong)local_34;
    lVar6 = 0;
    lVar4 = 0;
    iVar3 = local_38;
    do {
      if (0 < (int)uVar1) {
        lVar7 = 0;
        lVar5 = 0;
        do {
          boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>
          ::load<double>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>
                          *)this_00,
                         (double *)
                         ((long)(this->m_storage).m_data + lVar7 + (this->m_storage).m_rows * lVar6)
                        );
          lVar5 = lVar5 + 1;
          uVar1 = (ulong)(int)local_34;
          lVar7 = lVar7 + 8;
          iVar3 = local_38;
        } while (lVar5 < (long)uVar1);
      }
      lVar4 = lVar4 + 1;
      lVar6 = lVar6 + 8;
    } while (lVar4 < iVar3);
  }
  return;
}

Assistant:

inline void serialize(Archive & ar, const unsigned int version)
{
    int r = this->rows();     // makes sense for saving only
    int c = this->cols();

    ar & boost::serialization::make_nvp("rows",r);
    ar & boost::serialization::make_nvp("cols",c);

    this->resize(r,c);        // makes sense for loading only

    for(int j = 0; j < c; j++)
	    for(int i = 0; i < r; i++)
            ar & boost::serialization::make_nvp("data",this->operator()(i,j));
}